

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PeleLM.cpp
# Opt level: O3

void __thiscall
PeleLM::compute_enthalpy_fluxes(PeleLM *this,MultiFab **flux,MultiFab **beta,Real time)

{
  Geometry *__src;
  undefined8 *puVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  __uniq_ptr_data<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>,_true,_true> amrlevel;
  double dVar3;
  double dVar4;
  undefined1 auVar5 [12];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  pointer pBVar8;
  pointer pBVar9;
  Long LVar10;
  int i;
  FabType FVar11;
  double *pdVar12;
  StateDescriptor *this_00;
  Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *pVVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  double *pdVar17;
  BoxArray *pBVar18;
  pointer *ppbVar19;
  long lVar20;
  int n;
  int iVar21;
  ulong uVar22;
  double *pdVar23;
  double *pdVar24;
  int i_1;
  long lVar25;
  double *pdVar26;
  int iVar27;
  uint uVar28;
  PeleLM *this_01;
  double *pdVar29;
  long lVar30;
  bool bVar31;
  double dVar32;
  undefined1 auVar33 [16];
  double dVar34;
  undefined1 auVar35 [16];
  double dVar36;
  int iVar37;
  double dVar38;
  double dVar39;
  double dVar40;
  double dVar41;
  initializer_list<amrex::Geometry> __l;
  initializer_list<amrex::BoxArray> __l_00;
  initializer_list<amrex::DistributionMapping> __l_01;
  initializer_list<const_amrex::EBFArrayBoxFactory_*> __l_02;
  MFIter mfi;
  array<amrex::LinOpBCType,_3UL> mlmg_hibc;
  array<amrex::LinOpBCType,_3UL> mlmg_lobc;
  MultiFab TT;
  MultiFab Enth;
  MultiFab TTc;
  MLMG mg;
  MLEBABecLap op;
  double *local_1260;
  long local_1258;
  Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> local_1238;
  DistributionMapping *local_1218;
  long local_1210;
  long local_1208;
  Geometry *local_1200;
  long local_11f8;
  long local_11f0;
  long local_11e8;
  long local_11e0;
  long local_11d8;
  double *local_11d0;
  double *local_11c8;
  ulong local_11c0;
  long local_11b8;
  double *local_11b0;
  double *local_11a8;
  ulong local_11a0;
  ulong local_1198;
  Box local_118c;
  PeleLM *local_1170;
  Array4<const_double> local_1168;
  MFIter local_1128;
  Box local_10c4;
  Array4<double> local_10a8;
  double local_1068;
  long local_1060;
  LPInfo local_1058;
  undefined1 local_1038 [16];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1028;
  double dStack_1010;
  double local_1008;
  Vector<int,_std::allocator<int>_> *pVStack_1000;
  Vector<int,_std::allocator<int>_> *local_ff8;
  Vector<amrex::Box,_std::allocator<amrex::Box>_> *pVStack_ff0;
  Vector<int,_std::allocator<int>_> *local_fe8;
  Vector<int,_std::allocator<int>_> *pVStack_fe0;
  double local_fd8;
  double dStack_fd0;
  double local_fc8;
  double dStack_fc0;
  double local_fb8;
  double dStack_fb0;
  undefined1 local_fa8 [16];
  double local_f98;
  undefined1 local_ea8 [8];
  Arena *pAStack_ea0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  avStack_e98 [2];
  undefined8 local_e68;
  undefined8 uStack_e60;
  element_type *local_e58;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_e50;
  element_type *local_e48;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_e40;
  element_type *local_e38;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_e30;
  pointer local_e28;
  pointer piStack_e20;
  pointer local_e18;
  _Bit_type *p_Stack_e10;
  float local_e08 [56];
  MultiFab local_d28;
  MultiFab local_ba8;
  FabArray<amrex::FArrayBox> local_a20;
  FabArray<amrex::FArrayBox> local_8a0;
  MultiFab local_720;
  MLMG local_5a0;
  MLEBABecLap local_408;
  
  local_1068 = amrex::ParallelDescriptor::second();
  local_1058.do_semicoarsening = false;
  local_1058.agg_grid_size = -1;
  local_1058.con_grid_size = -1;
  local_1058.do_agglomeration = true;
  local_1058.do_consolidation = true;
  local_1058.has_metric_term = false;
  local_1058.max_coarsening_level = 0;
  local_1058.max_semicoarsening_level = 0;
  local_1058.semicoarsening_direction = -1;
  local_1058.hidden_direction = -1;
  pdVar12 = (double *)
            __dynamic_cast(*(undefined8 *)
                            ((long)(((this->super_NavierStokesBase).super_AmrLevel.parent)->
                                   amr_level).
                                   super_vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                                   .
                                   super__Vector_base<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start
                                   [(this->super_NavierStokesBase).super_AmrLevel.level]._M_t.
                                   super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                            + 0x218),&amrex::FabFactory<amrex::FArrayBox>::typeinfo,
                           &amrex::EBFArrayBoxFactory::typeinfo,0);
  if (pdVar12 == (double *)0x0) {
    __cxa_bad_cast();
  }
  __src = &(this->super_NavierStokesBase).super_AmrLevel.geom;
  memcpy((iterator)local_ea8,__src,200);
  __l._M_len = 1;
  __l._M_array = (iterator)local_ea8;
  std::vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>::vector
            ((vector<amrex::Geometry,_std::allocator<amrex::Geometry>_> *)local_1038,__l,
             (allocator_type *)&local_10a8);
  pBVar18 = &(this->super_NavierStokesBase).super_AmrLevel.grids;
  amrex::BoxArray::BoxArray((BoxArray *)&local_5a0,pBVar18);
  __l_00._M_len = 1;
  __l_00._M_array = (iterator)&local_5a0;
  std::vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>::vector
            ((vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *)&local_720,__l_00,
             (allocator_type *)&local_118c);
  local_1128.m_fa._M_t.
  super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
  super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
  super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl =
       (__uniq_ptr_data<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>,_true,_true>)
       (this->super_NavierStokesBase).super_AmrLevel.dmap.m_ref.
       super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var2 = (this->super_NavierStokesBase).super_AmrLevel.dmap.m_ref.
           super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  local_1128.fabArray._0_4_ = (int)p_Var2;
  local_1128.fabArray._4_4_ = (uint)((ulong)p_Var2 >> 0x20);
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
    }
  }
  __l_01._M_len = 1;
  __l_01._M_array = (iterator)&local_1128;
  std::vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>::vector
            ((vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_> *)
             &local_a20,__l_01,(allocator_type *)&local_10c4);
  __l_02._M_len = 1;
  __l_02._M_array = (iterator)&local_1168;
  local_1168.p = pdVar12;
  std::vector<const_amrex::EBFArrayBoxFactory_*,_std::allocator<const_amrex::EBFArrayBoxFactory_*>_>
  ::vector((vector<const_amrex::EBFArrayBoxFactory_*,_std::allocator<const_amrex::EBFArrayBoxFactory_*>_>
            *)&local_8a0,__l_02,(allocator_type *)&local_1238);
  amrex::MLEBABecLap::MLEBABecLap
            (&local_408,(Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_> *)local_1038,
             (Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *)&local_720,
             (Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_> *)
             &local_a20,&local_1058,
             (Vector<const_amrex::EBFArrayBoxFactory_*,_std::allocator<const_amrex::EBFArrayBoxFactory_*>_>
              *)&local_8a0,1);
  if (local_8a0.super_FabArrayBase._vptr_FabArrayBase != (_func_int **)0x0) {
    operator_delete(local_8a0.super_FabArrayBase._vptr_FabArrayBase,
                    local_8a0.super_FabArrayBase.boxarray.m_bat.m_op._4_8_ -
                    (long)local_8a0.super_FabArrayBase._vptr_FabArrayBase);
  }
  std::vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>::~vector
            ((vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_> *)
             &local_a20);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      CONCAT44(local_1128.fabArray._4_4_,(int)local_1128.fabArray) !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               CONCAT44(local_1128.fabArray._4_4_,(int)local_1128.fabArray));
  }
  std::vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>::~vector
            ((vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *)&local_720);
  amrex::BoxArray::~BoxArray((BoxArray *)&local_5a0);
  if ((FabArrayBase *)local_1038._0_8_ != (FabArrayBase *)0x0) {
    operator_delete((void *)local_1038._0_8_,
                    (long)local_1028.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start - local_1038._0_8_);
  }
  local_408.super_MLCellABecLap.super_MLCellLinOp.super_MLLinOp.maxorder =
       Diffusion::maxOrder((this->super_NavierStokesBase).diffusion);
  amrex::MLMG::MLMG(&local_5a0,(MLLinOp *)&local_408);
  this_00 = amrex::DescriptorList::operator[]((DescriptorList *)amrex::AmrLevel::desc_lst,0);
  pVVar13 = amrex::StateDescriptor::getBCs(this_00);
  Diffusion::setDomainBC
            ((array<amrex::LinOpBCType,_3UL> *)local_ea8,
             (array<amrex::LinOpBCType,_3UL> *)local_1038,
             (pVVar13->super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>).
             super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>._M_impl.
             super__Vector_impl_data._M_start + NavierStokesBase::Temp);
  amrex::MLLinOp::setDomainBC
            ((MLLinOp *)&local_408,(Array<BCType,_3> *)local_ea8,(Array<BCType,_3> *)local_1038);
  amrex::MultiFab::MultiFab(&local_720);
  lVar14 = (long)(this->super_NavierStokesBase).super_AmrLevel.level;
  if (0 < lVar14) {
    amrlevel.super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>._M_t.
    super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>.
    super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl =
         (((this->super_NavierStokesBase).super_AmrLevel.parent)->amr_level).
         super_vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
         .
         super__Vector_base<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start[lVar14 + -1]._M_t.
         super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>;
    local_ea8 = (undefined1  [8])0x1;
    pAStack_ea0 = (Arena *)0x0;
    avStack_e98[0].
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    avStack_e98[0].
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    avStack_e98[0].
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    amrex::MultiFab::define
              (&local_720,
               (BoxArray *)
               ((long)amrlevel.
                      super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>.
                      _M_t.
                      super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>
                      .super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl + 0xd8),
               (DistributionMapping *)
               ((long)amrlevel.
                      super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>.
                      _M_t.
                      super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>
                      .super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl + 0x140),1,0,
               (MFInfo *)local_ea8,
               (FabFactory<amrex::FArrayBox> *)
               (((unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                  *)((long)amrlevel.
                           super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>
                           .super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl + 0x218))->
               _M_t).
               super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
              );
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(avStack_e98);
    amrex::AmrLevel::FillPatch
              ((AmrLevel *)
               amrlevel.
               super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>._M_t.
               super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>.
               super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl,&local_720,0,time,0,
               NavierStokesBase::Temp,1,0);
    amrex::MLLinOp::setCoarseFineBC
              ((MLLinOp *)&local_408,&local_720,
               (this->super_NavierStokesBase).super_AmrLevel.crse_ratio.vect[0]);
  }
  local_1218 = &(this->super_NavierStokesBase).super_AmrLevel.dmap;
  local_ea8 = (undefined1  [8])0x1;
  pAStack_ea0 = (Arena *)0x0;
  avStack_e98[0].
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  avStack_e98[0].
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  avStack_e98[0].
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  amrex::MultiFab::MultiFab
            ((MultiFab *)&local_a20,pBVar18,local_1218,1,1,(MFInfo *)local_ea8,
             (this->super_NavierStokesBase).super_AmrLevel.m_factory._M_t.
             super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
             .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>._M_head_impl);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(avStack_e98);
  amrex::AmrLevel::FillPatch
            ((AmrLevel *)this,(MultiFab *)&local_a20,1,time,0,NavierStokesBase::Temp,1,0);
  amrex::MLCellLinOp::setLevelBC
            ((MLCellLinOp *)&local_408,0,(MultiFab *)&local_a20,(MultiFab *)0x0,(MultiFab *)0x0,
             (MultiFab *)0x0);
  amrex::MLEBABecLap::setScalars(&local_408,0.0,1.0);
  Diffusion::setBeta(&local_408,beta,0x15,1);
  local_ea8 = (undefined1  [8])0x0;
  pAStack_ea0 = (Arena *)((ulong)pAStack_ea0 & 0xffffffff00000000);
  amrex::FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
            (&(*flux)->super_FabArray<amrex::FArrayBox>,0.0,0x17,1,(IntVect *)local_ea8);
  local_ea8 = (undefined1  [8])0x0;
  pAStack_ea0 = (Arena *)((ulong)pAStack_ea0 & 0xffffffff00000000);
  amrex::FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
            (&flux[1]->super_FabArray<amrex::FArrayBox>,0.0,0x17,1,(IntVect *)local_ea8);
  local_ea8 = (undefined1  [8])0x0;
  pAStack_ea0 = (Arena *)((ulong)pAStack_ea0 & 0xffffffff00000000);
  amrex::FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
            (&flux[2]->super_FabArray<amrex::FArrayBox>,0.0,0x17,1,(IntVect *)local_ea8);
  Diffusion::computeExtensiveFluxes
            (&local_5a0,(MultiFab *)&local_a20,flux,0x17,1,
             (MultiFab *)&(this->super_NavierStokesBase).field_0x540,1.0);
  local_ea8 = (undefined1  [8])0x1;
  pAStack_ea0 = (Arena *)0x0;
  avStack_e98[0].
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  avStack_e98[0].
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  avStack_e98[0].
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  amrex::MultiFab::MultiFab
            ((MultiFab *)&local_8a0,pBVar18,local_1218,0x15,1,(MFInfo *)local_ea8,
             (this->super_NavierStokesBase).super_AmrLevel.m_factory._M_t.
             super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
             .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>._M_head_impl);
  local_1200 = __src;
  local_1170 = this;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(avStack_e98);
  amrex::MFIter::MFIter(&local_1128,&local_8a0.super_FabArrayBase,true);
  if (local_1128.currentIndex < local_1128.endIndex) {
    do {
      amrex::MFIter::growntilebox(&local_118c,&local_1128,-1000000);
      amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                (&local_1168,&local_a20,&local_1128);
      amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                (&local_10a8,&local_8a0,&local_1128,0);
      LVar10 = local_10a8.nstride;
      local_11c0 = CONCAT44(local_11c0._4_4_,local_118c.bigend.vect[2]);
      if (local_118c.smallend.vect[2] <= local_118c.bigend.vect[2]) {
        local_11d0 = local_1168.p;
        local_11b8 = CONCAT44(local_1168.jstride._4_4_,(int)local_1168.jstride);
        local_11d8 = CONCAT44(local_1168.kstride._4_4_,(int)local_1168.kstride);
        local_11e0 = (long)local_1168.begin.z;
        lVar14 = (long)local_1168.begin.y;
        lVar25 = (long)local_1168.begin.x;
        local_11a0 = (ulong)(uint)local_118c.bigend.vect[0];
        local_1210 = (long)local_118c.smallend.vect[1];
        local_1208 = (long)local_118c.smallend.vect[0];
        local_1198 = local_10a8.jstride * 8;
        local_11c8 = (double *)(ulong)(uint)local_118c.bigend.vect[1];
        local_11f8 = (local_1210 - local_10a8.begin.y) * local_1198 + local_1208 * 8 +
                     (long)local_10a8.begin.x * -8 + (long)local_10a8.p;
        local_11e8 = local_10a8.kstride << 3;
        local_11f0 = -(long)local_10a8.begin.z;
        iVar27 = local_118c.bigend.vect[0] + 1;
        local_11a8 = (double *)CONCAT44(local_11a8._4_4_,local_118c.bigend.vect[1] + 1);
        iVar21 = local_118c.smallend.vect[2];
        do {
          if ((int)local_1210 <= (int)local_11c8) {
            local_1260 = (double *)((local_11f0 + iVar21) * local_11e8 + local_11f8);
            local_11b0 = local_11d0 + (iVar21 - local_11e0) * local_11d8;
            local_1258 = local_1210;
            do {
              pdVar12 = local_11b0;
              if ((int)local_1208 <= (int)local_11a0) {
                lVar15 = (local_1258 - lVar14) * local_11b8;
                pdVar29 = local_1260;
                lVar30 = local_1208;
                do {
                  memset(local_1038,0,0xa8);
                  dVar32 = pdVar12[lVar15 + (lVar30 - lVar25)];
                  dVar38 = dVar32 * dVar32;
                  dVar36 = dVar32 * dVar38;
                  dVar34 = dVar32 * dVar36;
                  local_ea8 = (undefined1  [8])0x3fdfbefbefbefbf0;
                  pAStack_ea0 = (Arena *)0x3fefbefbefbefbf0;
                  avStack_e98[0].
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x3fb000418a43bf8c;
                  avStack_e98[0].
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x3fa000418a43bf8c;
                  avStack_e98[0].
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x3fae1af1b70e12fe;
                  avStack_e98[1].
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x3fac6bb6f569cbd9;
                  avStack_e98[1].
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x3f9f065042c3dbd3;
                  avStack_e98[1].
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x3fb24021df7a429e;
                  local_e68 = 0.07129108148570615;
                  uStack_e60 = 0.06651147322913202;
                  local_e58 = (element_type *)0x3fafea0b02aa32d7;
                  _Stack_e50._M_pi =
                       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x3fa24778bbe8f7dd;
                  local_e48 = (element_type *)0x3f9744998b9a1c0d;
                  _Stack_e40._M_pi =
                       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x3fa1a4eba7fd99b3;
                  local_e38 = (element_type *)0x3fa10d488e47ecc4;
                  _Stack_e30._M_pi =
                       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x3fa07f7f2eefd932;
                  local_e28 = (pointer)0x3fa24021df7a429e;
                  piStack_e20 = (pointer)0x3fa19e14f6ff5920;
                  local_e18 = (pointer)0x3fa106e55a53f15b;
                  p_Stack_e10 = (_Bit_type *)0x3fa246cdaf410bdd;
                  local_e08[0] = 6.940039e+19;
                  local_e08[1] = 1.2002503;
                  dVar39 = 1.0 / dVar32;
                  if (1000.0 <= dVar32) {
                    local_1038._0_8_ =
                         dVar39 * -950.158922 +
                         dVar34 * 4.00510752e-15 +
                         dVar36 * -4.48915985e-11 +
                         dVar38 * 1.66485593e-07 + dVar32 * -2.47012365e-05 + 3.3372792;
                    local_1038._8_8_ =
                         (FabArrayBase *)
                         (dVar39 * 25473.6599 +
                         dVar34 * 9.96394714e-23 +
                         dVar36 * -1.18378809e-18 +
                         dVar38 * 5.38539827e-15 + dVar32 * -1.15421486e-11 + 2.50000001);
                    local_1028.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start =
                         (pointer)(dVar39 * 29217.5791 +
                                  dVar34 * 2.45667382e-16 +
                                  dVar36 * -2.50444497e-12 +
                                  dVar38 * 1.39828196e-08 + dVar32 * -4.29870569e-05 + 2.56942078);
                    local_1028.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish =
                         (pointer)(dVar39 * -1088.45772 +
                                  dVar34 * -4.33435588e-15 +
                                  dVar36 * 5.23676387e-11 +
                                  dVar38 * -2.52655556e-07 + dVar32 * 0.00074154377 + 3.28253784);
                    local_1028.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage =
                         (pointer)(dVar39 * 3858.657 +
                                  dVar34 * 2.34824752e-15 +
                                  dVar36 * -2.19865389e-11 +
                                  dVar38 * 4.21684093e-08 + dVar32 * 0.000274214858 + 3.09288767);
                    dStack_1010 = dVar39 * -30004.2971 +
                                  dVar34 * 3.36401984e-15 +
                                  dVar36 * -2.42604967e-11 +
                                  dVar38 * -5.46908393e-08 + dVar32 * 0.00108845902 + 3.03399249;
                    local_1008 = dVar39 * 111.856713 +
                                 dVar34 * -2.1581707e-15 +
                                 dVar36 * 2.85615925e-11 +
                                 dVar38 * -2.11219383e-07 + dVar32 * 0.00111991006 + 4.0172109;
                    pVStack_1000 = (Vector<int,_std::allocator<int>_> *)
                                   (dVar39 * 46263.604 +
                                   dVar34 * -3.75455134e-15 +
                                   dVar36 * 6.50448872e-11 +
                                   dVar38 * -4.69648657e-07 + dVar32 * 0.00182819646 + 2.87410113);
                    local_ff8 = (Vector<int,_std::allocator<int>_> *)
                                (dVar39 * 50925.9997 +
                                dVar34 * -6.7943273e-15 +
                                dVar36 * 1.044765e-10 +
                                dVar38 * -6.70639823e-07 + dVar32 * 0.00232794318 + 2.29203842);
                    pVStack_ff0 = (Vector<amrex::Box,_std::allocator<amrex::Box>_> *)
                                  (dVar39 * 16775.5843 +
                                  dVar34 * -9.34308788e-15 +
                                  dVar36 * 1.48921161e-10 +
                                  dVar38 * -9.95714493e-07 + dVar32 * 0.00361995018 + 2.28571772);
                    local_fe8 = (Vector<int,_std::allocator<int>_> *)
                                (dVar39 * -9468.34459 +
                                dVar34 * -2.0363046e-14 +
                                dVar36 * 3.05731338e-10 +
                                dVar38 * -1.9109527e-06 + dVar32 * 0.00669547335 + 0.074851495);
                    pVStack_fe0 = (Vector<int,_std::allocator<int>_> *)
                                  (dVar39 * -14151.8724 +
                                  dVar34 * -4.07295432e-15 +
                                  dVar36 * 5.7513252e-11 +
                                  dVar38 * -3.32941924e-07 + dVar32 * 0.00103126372 + 2.71518561);
                    local_fd8 = dVar39 * -48759.166 +
                                dVar34 * -9.44168328e-15 +
                                dVar36 * 1.30872547e-10 +
                                dVar38 * -7.38271347e-07 + dVar32 * 0.00220718513 + 3.85746029;
                    dStack_fd0 = dVar39 * 4011.91815 +
                                 dVar34 * -1.06701742e-14 +
                                 dVar36 * 1.47290445e-10 +
                                 dVar38 * -8.28152043e-07 + dVar32 * 0.00247847763 + 2.77217438;
                    local_fc8 = dVar39 * -13995.8323 +
                                dVar34 * -1.76771128e-14 +
                                dVar36 * 2.5160303e-10 +
                                dVar38 * -1.47419604e-06 + dVar32 * 0.00460000041 + 1.76069008;
                    dStack_fc0 = dVar39 * 127.83252 +
                                 dVar34 * -4.225232e-15 +
                                 dVar36 * 9.8610775e-11 +
                                 dVar38 * -8.85461333e-07 + dVar32 * 0.0039357485 + 3.770799;
                    local_fb8 = dVar39 * 4939.88614 +
                                dVar34 * -2.51412122e-14 +
                                dVar36 * 3.68057308e-10 +
                                dVar38 * -2.23692638e-06 + dVar32 * 0.00732270755 + 2.03611116;
                    dStack_fb0 = dVar39 * 12857.52 +
                                 dVar34 * -2.99283152e-14 +
                                 dVar36 * 4.38044223e-10 +
                                 dVar38 * -2.66068889e-06 + dVar32 * 0.0086986361 + 1.95465642;
                    dVar40 = dVar34 * -3.8000578e-14 +
                             dVar36 * 5.53530003e-10 +
                             dVar38 * -3.3418689e-06 + dVar32 * 0.0108426339 + 1.0718815;
                    dVar41 = dVar34 * -1.3506702e-15 +
                             dVar36 * 2.5242595e-11 +
                             dVar38 * -1.89492e-07 + dVar32 * 0.0007439884 + 2.92664;
                    dVar3 = -11426.3932;
                    dVar4 = -922.7977;
                  }
                  else {
                    local_1038._0_8_ =
                         dVar39 * -917.935173 +
                         dVar34 * -1.47522352e-12 +
                         dVar36 * 5.03930235e-09 +
                         dVar38 * -6.492717e-06 + dVar32 * 0.00399026037 + 2.34433112;
                    local_1038._8_8_ =
                         (FabArrayBase *)
                         (dVar39 * 25473.6599 +
                         dVar34 * -1.85546466e-22 +
                         dVar36 * 5.7520408e-19 +
                         dVar38 * -6.65306547e-16 + dVar32 * 3.52666409e-13 + 2.5);
                    local_1028.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start =
                         (pointer)(dVar39 * 29122.2592 +
                                  dVar34 * 4.22531942e-13 +
                                  dVar36 * -1.53201656e-09 +
                                  dVar38 * 2.21435465e-06 + dVar32 * -0.00163965942 + 3.1682671);
                    local_1028.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish =
                         (pointer)(dVar39 * -1063.94356 +
                                  dVar34 * 6.48745674e-13 +
                                  dVar36 * -2.42032377e-09 +
                                  dVar38 * 3.282434e-06 + dVar32 * -0.00149836708 + 3.78245636);
                    local_1028.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage =
                         (pointer)(dVar39 * 3615.08056 +
                                  dVar34 * 2.7282294e-13 +
                                  dVar36 * -9.70283332e-10 +
                                  dVar38 * 1.5393128e-06 + dVar32 * -0.00120065876 + 3.99201543);
                    dStack_1010 = dVar39 * -30293.7267 +
                                  dVar34 * 3.54395634e-13 +
                                  dVar36 * -1.37199266e-09 +
                                  dVar38 * 2.17346737e-06 + dVar32 * -0.00101821705 + 4.19864056;
                    local_1008 = dVar39 * 294.80804 +
                                 dVar34 * 1.85845025e-12 +
                                 dVar36 * -6.06909735e-09 +
                                 dVar38 * 7.05276303e-06 + dVar32 * -0.00237456025 + 4.30179801;
                    pVStack_1000 = (Vector<int,_std::allocator<int>_> *)
                                   (dVar39 * 46004.0401 +
                                   dVar34 * 3.37483438e-13 +
                                   dVar36 * -9.62727883e-10 +
                                   dVar38 * 9.31632803e-07 + dVar32 * 0.000484436072 + 3.76267867);
                    local_ff8 = (Vector<int,_std::allocator<int>_> *)
                                (dVar39 * 50496.8163 +
                                dVar34 * 3.88629474e-13 +
                                dVar36 * -1.67203995e-09 +
                                dVar38 * 2.74432073e-06 + dVar32 * -0.0011833071 + 4.19860411);
                    pVStack_ff0 = (Vector<amrex::Box,_std::allocator<amrex::Box>_> *)
                                  (dVar39 * 16444.9988 +
                                  dVar34 * 5.08771468e-13 +
                                  dVar36 * -1.71779356e-09 +
                                  dVar38 * 1.91007285e-06 + dVar32 * 0.00100547588 + 3.6735904);
                    local_fe8 = (Vector<int,_std::allocator<int>_> *)
                                (dVar39 * -10246.6476 +
                                dVar34 * 3.33387912e-12 +
                                dVar36 * -1.21185757e-08 +
                                dVar38 * 1.63933533e-05 + dVar32 * -0.0068354894 + 5.14987613);
                    pVStack_fe0 = (Vector<int,_std::allocator<int>_> *)
                                  (dVar39 * -14344.086 +
                                  dVar34 * -1.808849e-13 +
                                  dVar36 * 2.26751471e-10 +
                                  dVar38 * 3.3893811e-07 + dVar32 * -0.00030517684 + 3.57953347);
                    local_fd8 = dVar39 * -48371.9697 +
                                dVar34 * -2.87399096e-14 +
                                dVar36 * 6.14797555e-10 +
                                dVar38 * -2.3745209e-06 + dVar32 * 0.00449229839 + 2.35677352;
                    dStack_fd0 = dVar39 * 3839.56496 +
                                 dVar34 * 8.6753773e-13 +
                                 dVar36 * -3.32860233e-09 +
                                 dVar38 * 4.59331487e-06 + dVar32 * -0.00162196266 + 4.22118584;
                    local_fc8 = dVar39 * -14308.9567 +
                                dVar34 * 2.63545304e-12 +
                                dVar36 * -9.48213152e-09 +
                                dVar38 * 1.24406669e-05 + dVar32 * -0.00495416684 + 4.79372315;
                    dStack_fc0 = dVar39 * 978.6011 +
                                 dVar34 * 4.15122e-13 +
                                 dVar36 * -1.844409e-09 +
                                 dVar38 * 1.77949067e-06 + dVar32 * 0.0036082975 + 2.106204;
                    local_fb8 = dVar39 * 5089.77593 +
                                dVar34 * 5.39768746e-12 +
                                dVar36 * -1.72897188e-08 +
                                dVar38 * 1.90330097e-05 + dVar32 * -0.00378526124 + 3.95920148;
                    dStack_fb0 = dVar39 * 12841.6265 +
                                 dVar34 * 4.61018008e-12 +
                                 dVar36 * -1.49781651e-08 +
                                 dVar38 * 1.65714269e-05 + dVar32 * -0.00209329446 + 4.30646568;
                    dVar40 = dVar34 * 5.37371542e-12 +
                             dVar36 * -1.77116571e-08 +
                             dVar38 * 1.99812763e-05 + dVar32 * -0.00275077135 + 4.29142492;
                    dVar41 = dVar34 * -4.889708e-13 +
                             dVar36 * 1.41037875e-09 +
                             dVar38 * -1.321074e-06 + dVar32 * 0.0007041202 + 3.298677;
                    dVar3 = -11522.2055;
                    dVar4 = -1020.8999;
                  }
                  dVar41 = dVar39 * dVar4 + dVar41;
                  local_fa8._8_4_ = SUB84(dVar41,0);
                  local_fa8._0_8_ = dVar39 * dVar3 + dVar40;
                  local_fa8._12_4_ = (int)((ulong)dVar41 >> 0x20);
                  local_f98 = dVar39 * -745.375 +
                              dVar34 * 0.0 + dVar36 * 0.0 + dVar38 * 0.0 + dVar32 * 0.0 + 2.5;
                  lVar16 = 0;
                  do {
                    *(double *)(local_1038 + lVar16 * 8) =
                         *(double *)(local_ea8 + lVar16 * 8) * dVar32 * 83144626.1815324 *
                         *(double *)(local_1038 + lVar16 * 8);
                    lVar16 = lVar16 + 1;
                  } while (lVar16 != 0x15);
                  lVar16 = 0;
                  pdVar17 = pdVar29;
                  do {
                    *pdVar17 = *(double *)(local_1038 + lVar16 * 8) * 0.0001;
                    lVar16 = lVar16 + 1;
                    pdVar17 = pdVar17 + LVar10;
                  } while (lVar16 != 0x15);
                  lVar30 = lVar30 + 1;
                  pdVar29 = pdVar29 + 1;
                } while (iVar27 != (int)lVar30);
              }
              local_1258 = local_1258 + 1;
              local_1260 = (double *)((long)local_1260 + local_1198);
            } while ((int)local_11a8 != (int)local_1258);
          }
          bVar31 = iVar21 != (int)local_11c0;
          iVar21 = iVar21 + 1;
        } while (bVar31);
      }
      amrex::MFIter::operator++(&local_1128);
    } while (local_1128.currentIndex < local_1128.endIndex);
  }
  amrex::MFIter::~MFIter(&local_1128);
  local_1238.super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>.
  super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_1238.super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>.
  super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_1238.super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>.
  super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_1238.super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>.
  super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)operator_new(0x1f8);
  this_01 = local_1170;
  local_1238.super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>.
  super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       local_1238.super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>.
       super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>._M_impl.
       super__Vector_impl_data._M_start + 0x15;
  lVar14 = 0;
  do {
    puVar1 = (undefined8 *)
             ((long)(local_1238.super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>.
                     super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>._M_impl.
                     super__Vector_impl_data._M_start)->bc + lVar14);
    *puVar1 = 0xfffffd66fffffd66;
    puVar1[1] = 0xfffffd66fffffd66;
    *(undefined8 *)
     ((long)(local_1238.super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>.
             super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>._M_impl.
             super__Vector_impl_data._M_start)->bc + lVar14 + 0x10) = 0xfffffd66fffffd66;
    lVar14 = lVar14 + 0x18;
  } while (lVar14 != 0x1f8);
  local_1238.super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>.
  super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>._M_impl.super__Vector_impl_data.
  _M_finish = local_1238.super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>.
              super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>._M_impl.
              super__Vector_impl_data._M_start + 0x15;
  pVVar13 = (Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *)local_ea8;
  NavierStokesBase::fetchBCArray(pVVar13,&local_1170->super_NavierStokesBase,0,first_spec,0x15);
  pBVar9 = local_1238.super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>.
           super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  pBVar8 = local_1238.super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>.
           super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>._M_impl.
           super__Vector_impl_data._M_start;
  local_1238.super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>.
  super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)local_ea8;
  local_1238.super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>.
  super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)pAStack_ea0;
  local_1238.super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>.
  super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       (pointer)avStack_e98[0].
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
  local_ea8 = (undefined1  [8])0x0;
  pAStack_ea0 = (Arena *)0x0;
  avStack_e98[0].
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  if ((pBVar8 != (pointer)0x0) &&
     (operator_delete(pBVar8,(long)pBVar9 - (long)pBVar8), local_ea8 != (undefined1  [8])0x0)) {
    operator_delete((void *)local_ea8,
                    (long)avStack_e98[0].
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start - (long)local_ea8);
  }
  lVar14 = 0;
  do {
    amrex::MultiFab::MultiFab((MultiFab *)(local_ea8 + lVar14));
    lVar14 = lVar14 + 0x180;
  } while (lVar14 != 0x480);
  lVar14 = 0;
  do {
    pBVar18 = amrex::AmrLevel::getEdgeBoxArray((AmrLevel *)this_01,(int)lVar14);
    local_1038._0_8_ =
         (__uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>)0x1;
    local_1028.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_1028.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_1038._8_8_ = (FabArrayBase *)0x0;
    local_1028.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (**(code **)(((pVVar13->super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>).
                  super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>._M_impl.
                  super__Vector_impl_data._M_start)->bc + 4))
              (pVVar13,pBVar18,local_1218,0x15,1,local_1038,
               (this_01->super_NavierStokesBase).super_AmrLevel.m_factory._M_t.
               super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
               .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>._M_head_impl);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_1028);
    lVar14 = lVar14 + 1;
    pVVar13 = pVVar13 + 0x10;
  } while (lVar14 != 3);
  amrex::EB_interp_CellCentroid_to_FaceCentroid
            ((MultiFab *)&local_8a0,(MultiFab *)local_ea8,&local_d28,&local_ba8,0,0,0x15,local_1200,
             &local_1238);
  amrex::MFIter::MFIter((MFIter *)local_1038,&local_a20.super_FabArrayBase,true);
  if ((int)local_1028.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage < dStack_1010._0_4_) {
    do {
      amrex::MFIter::tilebox(&local_118c,(MFIter *)local_1038);
      ppbVar19 = &local_1028.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage;
      if (local_ff8 != (Vector<int,_std::allocator<int>_> *)0x0) {
        ppbVar19 = (pointer *)
                   ((local_ff8->super_vector<int,_std::allocator<int>_>).
                    super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                    _M_start +
                   (int)local_1028.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
      }
      local_1128.m_fa._M_t.
      super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
      super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
      super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl =
           (__uniq_ptr_data<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>,_true,_true>
            )CONCAT44(local_118c.smallend.vect[1],local_118c.smallend.vect[0]);
      auVar5._4_4_ = local_118c.bigend.vect[1];
      auVar5._0_4_ = local_118c.bigend.vect[0];
      auVar5._8_4_ = local_118c.bigend.vect[2];
      local_1128.tile_size.vect._0_8_ = auVar5._4_8_;
      local_1128.tile_size.vect[2] = local_118c.btype.itype;
      local_1128.fabArray._0_4_ = local_118c.smallend.vect[2];
      local_1128.fabArray._4_4_ = local_118c.bigend.vect[0];
      FVar11 = amrex::EBCellFlagFab::getType
                         ((EBCellFlagFab *)
                          local_a20.m_fabs_v.
                          super__Vector_base<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>
                          ._M_impl.super__Vector_impl_data._M_start[*(int *)ppbVar19][1].
                          super_BaseFab<double>._vptr_BaseFab,(Box *)&local_1128);
      if (FVar11 == covered) {
        lVar14 = 0;
        do {
          amrex::MFIter::nodaltilebox((Box *)&local_1168,(MFIter *)local_1038,(int)lVar14);
          amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                    ((Array4<double> *)&local_1128,&flux[lVar14]->super_FabArray<amrex::FArrayBox>,
                     (MFIter *)local_1038,0x16);
          auVar7 = _DAT_0074fb40;
          auVar6 = _DAT_0074fb30;
          if ((int)local_1168.jstride <= local_1168.kstride._4_4_) {
            uVar28 = local_1168.jstride._4_4_ - (int)local_1168.p;
            auVar33._4_4_ = 0;
            auVar33._0_4_ = uVar28;
            auVar33._8_4_ = uVar28;
            auVar33._12_4_ = 0;
            lVar25 = CONCAT44(local_1128.fabArray._4_4_,(int)local_1128.fabArray) * 8;
            auVar33 = auVar33 ^ _DAT_0074fb40;
            iVar21 = (int)local_1168.jstride;
            do {
              if (local_1168.p._4_4_ <= (int)local_1168.kstride) {
                lVar15 = (long)local_1128.m_fa._M_t.
                               super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
                               .super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl +
                         ((long)iVar21 - (long)local_1128.endIndex) *
                         local_1128.tile_size.vect._0_8_ * 8 +
                         (long)(int)local_1168.p * 8 +
                         ((long)local_1168.p._4_4_ - (long)local_1128.beginIndex) * lVar25 +
                         (long)local_1128.currentIndex * -8 + 8;
                lVar30 = (long)local_1168.p._4_4_;
                do {
                  if ((int)local_1168.p <= local_1168.jstride._4_4_) {
                    uVar22 = 0;
                    do {
                      auVar35._8_4_ = (int)uVar22;
                      auVar35._0_8_ = uVar22;
                      auVar35._12_4_ = (int)(uVar22 >> 0x20);
                      auVar35 = (auVar35 | auVar6) ^ auVar7;
                      bVar31 = auVar33._0_4_ < auVar35._0_4_;
                      iVar27 = auVar33._4_4_;
                      iVar37 = auVar35._4_4_;
                      if ((bool)(~(iVar27 < iVar37 || iVar37 == iVar27 && bVar31) & 1)) {
                        *(undefined8 *)(lVar15 + -8 + uVar22 * 8) = 0x462f29c4eeb155e5;
                      }
                      if (iVar27 >= iVar37 && (iVar37 != iVar27 || !bVar31)) {
                        *(undefined8 *)(lVar15 + uVar22 * 8) = 0x462f29c4eeb155e5;
                      }
                      uVar22 = uVar22 + 2;
                    } while (((ulong)uVar28 + 2 & 0xfffffffffffffffe) != uVar22);
                  }
                  lVar30 = lVar30 + 1;
                  lVar15 = lVar15 + lVar25;
                } while ((int)local_1168.kstride + 1 != (int)lVar30);
              }
              bVar31 = iVar21 != local_1168.kstride._4_4_;
              iVar21 = iVar21 + 1;
            } while (bVar31);
          }
          lVar14 = lVar14 + 1;
        } while (lVar14 != 3);
      }
      else {
        lVar14 = 0;
        do {
          amrex::MFIter::nodaltilebox(&local_10c4,(MFIter *)local_1038,(int)lVar14);
          amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                    ((Array4<double> *)&local_1128,&flux[lVar14]->super_FabArray<amrex::FArrayBox>,
                     (MFIter *)local_1038,0);
          amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                    ((Array4<double> *)&local_1168,&flux[lVar14]->super_FabArray<amrex::FArrayBox>,
                     (MFIter *)local_1038,0x16);
          local_1060 = lVar14;
          amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                    (&local_10a8,(FabArray<amrex::FArrayBox> *)(local_ea8 + lVar14 * 0x180),
                     (MFIter *)local_1038);
          local_1210 = CONCAT44(local_1210._4_4_,local_10c4.bigend.vect[2]);
          if (local_10c4.smallend.vect[2] <= local_10c4.bigend.vect[2]) {
            local_11c8 = local_1168.p;
            local_11b0 = (double *)CONCAT44(local_1168.jstride._4_4_,(int)local_1168.jstride);
            local_11d0 = (double *)CONCAT44(local_1168.kstride._4_4_,(int)local_1168.kstride);
            lVar14 = (long)local_10c4.smallend.vect[1];
            lVar25 = (long)local_10c4.smallend.vect[0];
            local_1208 = local_10a8.jstride * 8;
            local_11f0 = (lVar14 - local_10a8.begin.y) * local_1208 + lVar25 * 8 +
                         (long)local_10a8.begin.x * -8 + (long)local_10a8.p;
            local_11e8 = local_10a8.kstride * 8;
            local_1218 = (DistributionMapping *)-(long)local_10a8.begin.z;
            local_11f8 = (lVar14 - local_1128.beginIndex) *
                         CONCAT44(local_1128.fabArray._4_4_,(int)local_1128.fabArray) * 8 +
                         lVar25 * 8 + (long)local_1128.currentIndex * -8 +
                         (long)local_1128.m_fa._M_t.
                               super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
                               .super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl;
            local_11d8 = local_1128.tile_size.vect._0_8_ * 8;
            local_11e0 = -(long)local_1128.endIndex;
            local_1200 = (Geometry *)(long)local_1168.begin.z;
            local_11b8 = (long)local_1168.begin.y;
            local_1198 = (ulong)(uint)local_10c4.bigend.vect[0];
            local_11c0 = (ulong)(uint)local_10c4.bigend.vect[1];
            local_11a0 = CONCAT44(local_11a0._4_4_,local_10c4.bigend.vect[1] + 1U);
            iVar21 = local_10c4.smallend.vect[2];
            do {
              if (local_10c4.smallend.vect[1] <= local_10c4.bigend.vect[1]) {
                lVar30 = (long)iVar21;
                pdVar29 = (double *)
                          (((long)&(local_1218->m_ref).
                                   super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_ptr + lVar30) * local_11e8 + local_11f0);
                pdVar12 = (double *)((local_11e0 + lVar30) * local_11d8 + local_11f8);
                local_11a8 = local_1168.p + (lVar30 - (long)local_1200) * (long)local_11d0;
                lVar30 = lVar14;
                do {
                  if (local_10c4.smallend.vect[0] <= local_10c4.bigend.vect[0]) {
                    lVar16 = (lVar30 - local_11b8) * (long)local_11b0;
                    lVar15 = lVar25;
                    pdVar17 = pdVar29;
                    pdVar23 = pdVar12;
                    do {
                      local_11a8[lVar16 + (lVar15 - local_1168.begin.x)] = 0.0;
                      dVar32 = 0.0;
                      lVar20 = 0x15;
                      pdVar24 = pdVar17;
                      pdVar26 = pdVar23;
                      do {
                        dVar32 = dVar32 + *pdVar26 * *pdVar24;
                        local_11a8[lVar16 + (lVar15 - local_1168.begin.x)] = dVar32;
                        pdVar24 = pdVar24 + local_10a8.nstride;
                        pdVar26 = pdVar26 + CONCAT44(local_1128._28_4_,local_1128.tile_size.vect[2])
                        ;
                        lVar20 = lVar20 + -1;
                      } while (lVar20 != 0);
                      lVar15 = lVar15 + 1;
                      pdVar17 = pdVar17 + 1;
                      pdVar23 = pdVar23 + 1;
                    } while (local_10c4.bigend.vect[0] + 1U != (int)lVar15);
                  }
                  lVar30 = lVar30 + 1;
                  pdVar29 = pdVar29 + local_10a8.jstride;
                  pdVar12 = pdVar12 + CONCAT44(local_1128.fabArray._4_4_,(int)local_1128.fabArray);
                } while (local_10c4.bigend.vect[1] + 1U != (int)lVar30);
              }
              bVar31 = iVar21 != local_10c4.bigend.vect[2];
              iVar21 = iVar21 + 1;
            } while (bVar31);
          }
          lVar14 = local_1060 + 1;
        } while (lVar14 != 3);
      }
      amrex::MFIter::operator++((MFIter *)local_1038);
      this_01 = local_1170;
    } while ((int)local_1028.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage < dStack_1010._0_4_);
  }
  amrex::MFIter::~MFIter((MFIter *)local_1038);
  if (3 < NavierStokesBase::verbose) {
    dVar32 = amrex::ParallelDescriptor::second();
    local_1038._8_8_ = amrex::OutStream();
    local_1038._4_4_ = *(undefined4 *)(DAT_00816950 + -0x48);
    local_1038._0_4_ = *(undefined4 *)(DAT_00816950 + -0x30);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1028);
    *(undefined8 *)
     ((long)&local_1028.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish +
     *(long *)((((pointer)
                ((long)local_1028.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + -200))->domain).smallend.vect + 1
              )) = *(undefined8 *)
                    ((long)&(((BoxArray *)(local_1038._8_8_ + 8))->m_bat).m_bat_type +
                    *(long *)(*(long *)(CoordSys *)local_1038._8_8_ + -0x18));
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1028,"      PeleLM::compute_enthalpy_fluxes(): lev: ",0x2e);
    std::ostream::operator<<
              ((ostringstream *)&local_1028,(this_01->super_NavierStokesBase).super_AmrLevel.level);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1028,", time: ",8);
    std::ostream::_M_insert<double>(dVar32 - local_1068);
    local_1128.m_fa._M_t.
    super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
    super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
    super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl._0_1_ = 10;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1028,(char *)&local_1128,1)
    ;
    amrex::Print::~Print((Print *)local_1038);
  }
  lVar14 = 0x300;
  do {
    amrex::MultiFab::~MultiFab((MultiFab *)(local_ea8 + lVar14));
    lVar14 = lVar14 + -0x180;
  } while (lVar14 != -0x180);
  if (local_1238.super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>.
      super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1238.super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>.
                    super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_1238.super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>.
                          super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_1238.super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>.
                          super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  amrex::MultiFab::~MultiFab((MultiFab *)&local_8a0);
  amrex::MultiFab::~MultiFab((MultiFab *)&local_a20);
  amrex::MultiFab::~MultiFab(&local_720);
  amrex::MLMG::~MLMG(&local_5a0);
  amrex::MLEBABecLap::~MLEBABecLap(&local_408);
  return;
}

Assistant:

void
PeleLM::compute_enthalpy_fluxes (MultiFab* const*       flux,
                                 const MultiFab* const* beta,
                                 Real                   time)
{
  BL_PROFILE("PLM::compute_enthalpy_fluxes()");
  /*
    Build heat fluxes based on species fluxes, Gamma_m, and fill-patched cell-centered states
    Set:
         flux[NUM_SPECIES+1] = sum_m (H_m Gamma_m)
         flux[NUM_SPECIES+2] = - lambda grad T
  */

  AMREX_ASSERT(beta && beta[0]->nComp() == NUM_SPECIES+1);

  const Real strt_time = ParallelDescriptor::second();

  //
  // First step, we create an operator to get (EB-aware) fluxes from, it will provide flux[NUM_SPECIES+2]
  //

  LPInfo info;
  info.setAgglomeration(1);
  info.setConsolidation(1);
  info.setMetricTerm(false);
  info.setMaxCoarseningLevel(0);

#ifdef AMREX_USE_EB
  const auto& ebf = &dynamic_cast<EBFArrayBoxFactory const&>((parent->getLevel(level)).Factory());
  MLEBABecLap op({geom}, {grids}, {dmap}, info, {ebf});
#else
  MLABecLaplacian op({geom}, {grids}, {dmap}, info);
#endif

  op.setMaxOrder(diffusion->maxOrder());
  MLMG mg(op);

  {
    const Vector<BCRec>& theBCs = AmrLevel::desc_lst[State_Type].getBCs();
    const BCRec& bc = theBCs[Temp];

    std::array<LinOpBCType,AMREX_SPACEDIM> mlmg_lobc;
    std::array<LinOpBCType,AMREX_SPACEDIM> mlmg_hibc;
    Diffusion::setDomainBC(mlmg_lobc, mlmg_hibc, bc); // Same for all comps, by assumption
    op.setDomainBC(mlmg_lobc, mlmg_hibc);
  }

  MultiFab TTc;
  if (level > 0)
  {
    PeleLM& clev = getLevel(level-1);
    TTc.define(clev.grids,clev.dmap,1,0,MFInfo(),clev.Factory());
    FillPatch(clev,TTc,0,time,State_Type,Temp,1,0);
    op.setCoarseFineBC(&TTc, crse_ratio[0]);
  }
  int ngrow = 1;
  MultiFab TT(grids,dmap,1,ngrow,MFInfo(),Factory());
  FillPatch(*this,TT,ngrow,time,State_Type,Temp,1,0);
  op.setLevelBC(0, &TT);

  // Creating alpha and beta coefficients.
  Real      a               = 0;
  Real      b               = 1.;
  op.setScalars(a, b);


  // Here it is NUM_SPECIES because lambda is stored after the last species (first starts at 0)
  Diffusion::setBeta(op,beta,NUM_SPECIES);

  AMREX_D_TERM( flux[0]->setVal(0., NUM_SPECIES+2, 1);,
                flux[1]->setVal(0., NUM_SPECIES+2, 1);,
                flux[2]->setVal(0., NUM_SPECIES+2, 1););

  // Here it is NUM_SPECIES+2 because this is the heat flux (NUM_SPECIES+3 in enth_diff_terms in fortran)
  // No multiplication by dt here
  diffusion->computeExtensiveFluxes(mg, TT, flux, NUM_SPECIES+2, 1, area, b);

  //
  // Now we have flux[NUM_SPECIES+2]
  // Second step, let's compute flux[NUM_SPECIES+1] = sum_m (H_m Gamma_m)


   // First we want to gather h_i from T and then interpolate it to face centroids
   MultiFab Enth(grids,dmap,NUM_SPECIES,ngrow,MFInfo(),Factory());

#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
   for (MFIter mfi(Enth,TilingIfNotGPU()); mfi.isValid(); ++mfi)
   {
       const Box& gbx = mfi.growntilebox();
       auto const& T  = TT.const_array(mfi);
       auto const& Hi = Enth.array(mfi,0);

       amrex::ParallelFor(gbx, [T, Hi]
       AMREX_GPU_DEVICE (int i, int j, int k) noexcept
       {
          getHGivenT( i, j, k, T, Hi );
       });
   }

  Vector<BCRec> math_bc(NUM_SPECIES);
  math_bc = fetchBCArray(State_Type,first_spec,NUM_SPECIES);

  MultiFab enth_edgstate[AMREX_SPACEDIM];

  for (int idim = 0; idim < AMREX_SPACEDIM; idim++) {
    const BoxArray& ba = getEdgeBoxArray(idim);
    enth_edgstate[idim].define(ba, dmap, NUM_SPECIES, 1, MFInfo(), Factory());
  }

#ifdef AMREX_USE_EB
   EB_interp_CellCentroid_to_FaceCentroid(Enth, AMREX_D_DECL(enth_edgstate[0],enth_edgstate[1],enth_edgstate[2]), 0, 0, NUM_SPECIES, geom, math_bc);

#else
   const Box& domain = geom.Domain();
   bool use_harmonic_avg = def_harm_avg_cen2edge ? true : false;

#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
   for (MFIter mfi(Enth,TilingIfNotGPU()); mfi.isValid();++mfi)
   {
      for (int dir = 0; dir < AMREX_SPACEDIM; dir++)
      {
         const Box ebx = mfi.nodaltilebox(dir);
         const Box& edomain = amrex::surroundingNodes(domain,dir);
         const auto& enth_c  = Enth.array(mfi,0);
         const auto& enth_ed = enth_edgstate[dir].array(mfi,0);
         const auto bc_lo = fpi_phys_loc(math_bc[0].lo(dir));
         const auto bc_hi = fpi_phys_loc(math_bc[0].hi(dir));
         amrex::ParallelFor(ebx, [dir, bc_lo, bc_hi, use_harmonic_avg, enth_c, enth_ed, edomain]
         AMREX_GPU_DEVICE (int i, int j, int k) noexcept
         {
            int idx[3] = {i,j,k};
            bool on_lo = ( ( bc_lo == HT_Edge ) && ( idx[dir] <= edomain.smallEnd(dir) ) );
            bool on_hi = ( ( bc_hi == HT_Edge ) && ( idx[dir] >= edomain.bigEnd(dir) ) );
            cen2edg_cpp( i, j, k, dir, NUM_SPECIES, use_harmonic_avg, on_lo, on_hi, enth_c, enth_ed);
         });
      }
   }
#endif

    //
    // Now we construct the actual fluxes: sum[ (species flux).(species enthalpy) ]
    //

#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
    for (MFIter mfi(TT,TilingIfNotGPU()); mfi.isValid(); ++mfi) {
#ifdef AMREX_USE_EB
        const Box &bx = mfi.tilebox();
        // this is to check efficiently if this tile contains any eb stuff
        const EBFArrayBox& in_fab = static_cast<EBFArrayBox const&>(TT[mfi]);
        const EBCellFlagFab& flags = in_fab.getEBCellFlagFab();

        if(flags.getType(amrex::grow(bx, 0)) == FabType::covered)
        {
            // If tile is completely covered by EB geometry, set
            // value to some very large number so we know if
            // we accidentaly use these covered vals later in calculations
            for (int dir = 0; dir < AMREX_SPACEDIM; ++dir)
            {
                const Box&  ebox_d          = mfi.nodaltilebox(dir);
                auto const& flux_enthaply_d = (*flux[dir]).array(mfi, NUM_SPECIES+1);

                amrex::ParallelFor(ebox_d, [=]
                AMREX_GPU_DEVICE (int i, int j, int k) noexcept
                {
                    flux_enthaply_d(i,j,k) = 1.2345e30;
                });
            }
        } else {
#endif
            for (int dir = 0; dir < AMREX_SPACEDIM; ++dir) {
                const Box&  ebox_d          = mfi.nodaltilebox(dir);
                auto const& flux_species_d  = (*flux[dir]).array(mfi, 0);
                auto const& flux_enthaply_d = (*flux[dir]).array(mfi, NUM_SPECIES+1);
                auto const& enth_d          = enth_edgstate[dir].array(mfi);

                amrex::ParallelFor(ebox_d, [=]
                AMREX_GPU_DEVICE (int i, int j, int k) noexcept
                {
                    flux_enthaply_d(i,j,k) = 0.0;
                    for (int n = 0; n < NUM_SPECIES; n++) {
                        flux_enthaply_d(i,j,k) += flux_species_d(i,j,k,n)*enth_d(i,j,k,n);
                    }
                });
            }
#ifdef AMREX_USE_EB
        }
#endif
    }

    if (verbose > 3)
    {
      const int IOProc   = ParallelDescriptor::IOProcessorNumber();
      Real      run_time = ParallelDescriptor::second() - strt_time;
      ParallelDescriptor::ReduceRealMax(run_time,IOProc);
      amrex::Print() << "      PeleLM::compute_enthalpy_fluxes(): lev: " << level
                     << ", time: " << run_time << '\n';
    }
}